

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall google::protobuf::anon_unknown_0::TestIgnorer::~TestIgnorer(TestIgnorer *this)

{
  util::MessageDifferencer::IgnoreCriteria::~IgnoreCriteria(&this->super_IgnoreCriteria);
  operator_delete(this,8);
  return;
}

Assistant:

bool IsIgnored(const Message& message1, const Message& message2,
                 const FieldDescriptor* field,
                 const std::vector<util::MessageDifferencer::SpecificField>&
                     parent_fields) override {
    std::string name = "";
    for (size_t i = 0; i < parent_fields.size(); ++i) {
      absl::StrAppend(&name, parent_fields[i].field->name(), ".");
    }
    absl::StrAppend(&name, field->name());
    for (size_t i = 0; i < ABSL_ARRAYSIZE(kIgnoredFields); ++i) {
      if (name == kIgnoredFields[i]) {
        return true;
      }
    }
    return false;
  }